

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::parseRotationParameter(QPDFJob *this,string *parameter)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  undefined8 extraout_RAX;
  int iVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string angle_str;
  string range;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  angle_str._M_dataplus._M_p = (pointer)&angle_str.field_2;
  angle_str._M_string_length = 0;
  angle_str.field_2._M_local_buf[0] = '\0';
  range._M_dataplus._M_p = (pointer)&range.field_2;
  range._M_string_length = 0;
  range.field_2._M_local_buf[0] = '\0';
  lVar3 = std::__cxx11::string::find((char)parameter,0x3a);
  if (lVar3 == -1) {
    std::__cxx11::string::_M_assign((string *)&angle_str);
  }
  else {
    if (lVar3 != 0) {
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)parameter);
      std::__cxx11::string::operator=((string *)&angle_str,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    if (lVar3 + 1U < parameter->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)parameter);
      std::__cxx11::string::operator=((string *)&range,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  if (angle_str._M_string_length == 0) {
    iVar7 = 0;
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::at((ulong)&angle_str);
    cVar1 = *pcVar4;
    if ((cVar1 == '-') || (cVar1 == '+')) {
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)&angle_str);
      iVar7 = (uint)(cVar1 == '+') * 2 + -1;
      std::__cxx11::string::operator=((string *)&angle_str,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      iVar7 = 0;
      pcVar4 = (char *)std::__cxx11::string::at((ulong)&angle_str);
      if (9 < (byte)(*pcVar4 - 0x30U)) {
        std::__cxx11::string::assign((char *)&angle_str);
      }
    }
  }
  if (range._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&range);
  }
  QUtil::parse_numrange((vector<int,_std::allocator<int>_> *)&local_40,range._M_dataplus._M_p,0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  iVar2 = QUtil::string_to_int(angle_str._M_dataplus._M_p);
  iVar6 = (int)((long)iVar2 % 0x168);
  if ((short)((short)((long)iVar2 % 0x168) % 0x5a) == 0) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>_>
             ::operator[](&((this->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->rotations,&range);
    iVar2 = -iVar6;
    if (iVar7 != -1) {
      iVar2 = iVar6;
    }
    pmVar5->angle = iVar2;
    pmVar5->relative = iVar7 != 0;
    std::__cxx11::string::~string((string *)&range);
    std::__cxx11::string::~string((string *)&angle_str);
    return;
  }
  std::operator+(&local_a0,"invalid parameter to rotate (angle must be a multiple of 90): ",
                 parameter);
  usage(&local_a0);
  std::__cxx11::string::~string((string *)&range);
  std::__cxx11::string::~string((string *)&angle_str);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
QPDFJob::parseRotationParameter(std::string const& parameter)
{
    std::string angle_str;
    std::string range;
    size_t colon = parameter.find(':');
    int relative = 0;
    if (colon != std::string::npos) {
        if (colon > 0) {
            angle_str = parameter.substr(0, colon);
        }
        if (colon + 1 < parameter.length()) {
            range = parameter.substr(colon + 1);
        }
    } else {
        angle_str = parameter;
    }
    if (angle_str.length() > 0) {
        char first = angle_str.at(0);
        if ((first == '+') || (first == '-')) {
            relative = ((first == '+') ? 1 : -1);
            angle_str = angle_str.substr(1);
        } else if (!util::is_digit(angle_str.at(0))) {
            angle_str = "";
        }
    }
    if (range.empty()) {
        range = "1-z";
    }
    try {
        QUtil::parse_numrange(range.c_str(), 0);
    } catch (std::runtime_error const&) {
        usage("invalid parameter to rotate: " + parameter);
    }
    int angle = QUtil::string_to_int(angle_str.c_str()) % 360;
    if (angle % 90 != 0) {
        usage("invalid parameter to rotate (angle must be a multiple of 90): " + parameter);
    }
    if (relative == -1) {
        angle = -angle;
    }
    m->rotations[range] = RotationSpec(angle, (relative != 0));
}